

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O2

void Curl_doh_cleanup(Curl_easy *data)

{
  doh_probes *pdVar1;
  long lVar2;
  
  pdVar1 = (data->state).async.doh;
  if (pdVar1 != (doh_probes *)0x0) {
    Curl_doh_close(data);
    for (lVar2 = 8; lVar2 != 0x68; lVar2 = lVar2 + 0x30) {
      Curl_dyn_free((dynbuf *)((long)&pdVar1->probe_resp[0].probe_mid + lVar2));
    }
    (*Curl_cfree)((data->state).async.doh);
    (data->state).async.doh = (doh_probes *)0x0;
  }
  return;
}

Assistant:

void Curl_doh_cleanup(struct Curl_easy *data)
{
  struct doh_probes *dohp = data->state.async.doh;
  if(dohp) {
    int i;
    Curl_doh_close(data);
    for(i = 0; i < DOH_SLOT_COUNT; ++i) {
      Curl_dyn_free(&dohp->probe_resp[i].body);
    }
    Curl_safefree(data->state.async.doh);
  }
}